

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

long dprintf_DollarString(char *input,char **end)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  
  pcVar4 = input + 1;
  iVar3 = 0;
  while( true ) {
    iVar1 = Curl_isdigit((uint)(byte)pcVar4[-1]);
    if (iVar1 == 0) break;
    iVar3 = iVar3 * 10 + (int)pcVar4[-1] + -0x30;
    pcVar4 = pcVar4 + 1;
  }
  if ((iVar3 == 0) || (pcVar4[-1] != '$')) {
    lVar2 = 0;
  }
  else {
    *end = pcVar4;
    lVar2 = (long)iVar3;
  }
  return lVar2;
}

Assistant:

static long dprintf_DollarString(char *input, char **end)
{
  int number = 0;
  while(ISDIGIT(*input)) {
    number *= 10;
    number += *input-'0';
    input++;
  }
  if(number && ('$'==*input++)) {
    *end = input;
    return number;
  }
  return 0;
}